

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

SerialArenaChunk *
google::protobuf::internal::ThreadSafeArena::NewSerialArenaChunk
          (uint32_t prev_capacity,void *id,SerialArena *serial)

{
  bool bVar1;
  long lVar2;
  void *pvVar3;
  string *me;
  undefined7 extraout_var;
  SerialArenaChunk *pSVar4;
  SerialArenaChunk *pSVar5;
  char *__function;
  SerialArena *serial_00;
  uint uVar6;
  undefined1 *puVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auStack_38 [16];
  
  uVar8 = (ulong)prev_capacity << 6;
  if (0xfbf < uVar8) {
    uVar8 = 0xfc0;
  }
  uVar8 = uVar8 + 0x40;
  lVar2 = __tls_get_addr(&PTR_004d45e8);
  if (*(code **)(lVar2 + 0x28) == (code *)0x0) {
    pvVar3 = operator_new(uVar8);
    auVar9._8_8_ = uVar8;
    auVar9._0_8_ = pvVar3;
  }
  else {
    auVar9 = (**(code **)(lVar2 + 0x28))(uVar8,*(undefined8 *)(lVar2 + 0x30));
  }
  uVar6 = auVar9._8_4_ - 0x10;
  uVar8 = (ulong)(uVar6 & 0xfffffff0) + 0x10;
  if (auVar9._8_8_ < uVar8) {
    me = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                   (uVar8,auVar9._8_8_,"SerialArenaChunk::AllocSize(next_capacity) <= mem.n");
  }
  else {
    me = (string *)0x0;
  }
  puVar7 = auStack_38;
  if (me == (string *)0x0) {
    SerialArenaChunk::SerialArenaChunk(auVar9._0_8_,uVar6 >> 4,id,serial);
    return auVar9._0_8_;
  }
  NewSerialArenaChunk();
  pSVar5 = *(SerialArenaChunk **)(puVar7 + 0x20);
  if (((ulong)pSVar5 & 7) == 0) {
    if (*(int *)(pSVar5 + 8) != 0) {
      bVar1 = SerialArenaChunk::insert(pSVar5,me,serial_00);
      if (bVar1) {
        return (SerialArenaChunk *)CONCAT71(extraout_var,bVar1);
      }
    }
    absl::lts_20240722::Mutex::Lock();
    pSVar4 = *(SerialArenaChunk **)(puVar7 + 0x20);
    if ((pSVar4 != pSVar5) &&
       (bVar1 = SerialArenaChunk::insert(pSVar4,me,serial_00), pSVar5 = pSVar4, bVar1)) {
LAB_001c46df:
      pSVar5 = (SerialArenaChunk *)absl::lts_20240722::Mutex::Unlock();
      return pSVar5;
    }
    if (((ulong)pSVar5 & 7) == 0) {
      pSVar4 = NewSerialArenaChunk(*(uint32_t *)(pSVar5 + 8),me,serial_00);
      if (((ulong)pSVar4 & 7) == 0) {
        *(SerialArenaChunk **)pSVar4 = pSVar5;
        *(SerialArenaChunk **)(puVar7 + 0x20) = pSVar4;
        goto LAB_001c46df;
      }
      __function = 
      "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = char]"
      ;
      goto LAB_001c4722;
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = const char]"
  ;
LAB_001c4722:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,__function);
}

Assistant:

ThreadSafeArena::SerialArenaChunk* ThreadSafeArena::NewSerialArenaChunk(
    uint32_t prev_capacity, void* id, SerialArena* serial) {
  constexpr size_t kMaxBytes = 4096;  // Can hold up to 255 entries.
  constexpr size_t kGrowthFactor = 4;
  constexpr size_t kHeaderSize = SerialArenaChunk::AllocSize(0);
  constexpr size_t kEntrySize = SerialArenaChunk::AllocSize(1) - kHeaderSize;

  // On x64 arch: {4, 16, 64, 256, 256, ...} * 16.
  size_t prev_bytes = SerialArenaChunk::AllocSize(prev_capacity);
  size_t next_bytes = std::min(kMaxBytes, prev_bytes * kGrowthFactor);
  uint32_t next_capacity =
      static_cast<uint32_t>(next_bytes - kHeaderSize) / kEntrySize;
  // Growth based on bytes needs to be adjusted by AllocSize.
  next_bytes = SerialArenaChunk::AllocSize(next_capacity);

  // If we allocate bigger memory than requested, we should expand
  // size to use that extra space, and add extra entries permitted
  // by the extra space.
  SizedPtr mem = AllocateAtLeast(next_bytes);
  next_capacity = static_cast<uint32_t>(mem.n - kHeaderSize) / kEntrySize;
  ABSL_DCHECK_LE(SerialArenaChunk::AllocSize(next_capacity), mem.n);
  return new (mem.p) SerialArenaChunk{next_capacity, id, serial};
}